

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_upstream.c
# Opt level: O0

ngx_int_t ngx_http_upstream_rewrite_set_cookie
                    (ngx_http_request_t *r,ngx_table_elt_t *h,ngx_uint_t offset)

{
  ngx_table_elt_t *__dest;
  ngx_table_elt_t *ho;
  ngx_int_t rc;
  ngx_uint_t offset_local;
  ngx_table_elt_t *h_local;
  ngx_http_request_t *r_local;
  
  __dest = (ngx_table_elt_t *)ngx_list_push(&(r->headers_out).headers);
  if (__dest == (ngx_table_elt_t *)0x0) {
    r_local = (ngx_http_request_t *)0xffffffffffffffff;
  }
  else {
    memcpy(__dest,h,0x30);
    if (r->upstream->rewrite_cookie ==
        (_func_ngx_int_t_ngx_http_request_t_ptr_ngx_table_elt_t_ptr *)0x0) {
      r_local = (ngx_http_request_t *)0x0;
    }
    else {
      r_local = (ngx_http_request_t *)(*r->upstream->rewrite_cookie)(r,__dest);
      if (r_local == (ngx_http_request_t *)0xfffffffffffffffb) {
        r_local = (ngx_http_request_t *)0x0;
      }
      else if ((r_local == (ngx_http_request_t *)0x0) &&
              ((r->connection->log->log_level & 0x100) != 0)) {
        ngx_log_error_core(8,r->connection->log,0,"rewritten cookie: \"%V\"",&__dest->value);
      }
    }
  }
  return (ngx_int_t)r_local;
}

Assistant:

static ngx_int_t
ngx_http_upstream_rewrite_set_cookie(ngx_http_request_t *r, ngx_table_elt_t *h,
    ngx_uint_t offset)
{
    ngx_int_t         rc;
    ngx_table_elt_t  *ho;

    ho = ngx_list_push(&r->headers_out.headers);
    if (ho == NULL) {
        return NGX_ERROR;
    }

    *ho = *h;

    if (r->upstream->rewrite_cookie) {
        rc = r->upstream->rewrite_cookie(r, ho);

        if (rc == NGX_DECLINED) {
            return NGX_OK;
        }

#if (NGX_DEBUG)
        if (rc == NGX_OK) {
            ngx_log_debug1(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                           "rewritten cookie: \"%V\"", &ho->value);
        }
#endif

        return rc;
    }

    return NGX_OK;
}